

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# formatter.cpp
# Opt level: O0

string_type * __thiscall
booster::locale::impl_icu::number_format<wchar_t>::format_abi_cxx11_
          (number_format<wchar_t> *this,int64_t value,size_t *code_points)

{
  int iVar1;
  long *in_RCX;
  UnicodeString *in_RDX;
  long in_RSI;
  string_type *in_RDI;
  UnicodeString tmp;
  UnicodeString local_60 [48];
  UnicodeString *in_stack_ffffffffffffffd0;
  icu_std_converter<wchar_t,_4> *in_stack_ffffffffffffffd8;
  
  icu_70::UnicodeString::UnicodeString((UnicodeString *)in_RDI);
  icu_70::NumberFormat::format(*(long *)(in_RSI + 0x10),in_RDX);
  iVar1 = icu_70::UnicodeString::countChar32((int)local_60,0);
  *in_RCX = (long)iVar1;
  icu_std_converter<wchar_t,4>::std_abi_cxx11_(in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd0);
  icu_70::UnicodeString::~UnicodeString(local_60);
  return in_RDI;
}

Assistant:

virtual string_type format(int64_t value,size_t &code_points) const
            {
                icu::UnicodeString tmp;
                icu_fmt_->format(static_cast< ::int64_t>(value),tmp);
                code_points=tmp.countChar32();
                return cvt_.std(tmp);
            }